

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_snap_prev(ASMState *as)

{
  ulong uVar1;
  uintptr_t ofs;
  ASMState *as_local;
  
  if (as->curins < as->snapref) {
    uVar1 = (long)as->mctoporig - (long)as->mcp;
    if (0xffff < uVar1) {
      lj_trace_err(as->J,LJ_TRERR_MCODEOV);
    }
    do {
      if (as->snapno == 0) {
        return;
      }
      as->snapno = as->snapno - 1;
      as->snapref = (uint)as->T->snap[as->snapno].ref;
      as->T->snap[as->snapno].mcofs = (uint16_t)uVar1;
    } while (as->curins < as->snapref);
    as->snapalloc = 1;
  }
  return;
}

Assistant:

static void asm_snap_prev(ASMState *as)
{
  if (as->curins < as->snapref) {
    uintptr_t ofs = (uintptr_t)(as->mctoporig - as->mcp);
    if (ofs >= 0x10000) lj_trace_err(as->J, LJ_TRERR_MCODEOV);
    do {
      if (as->snapno == 0) return;
      as->snapno--;
      as->snapref = as->T->snap[as->snapno].ref;
      as->T->snap[as->snapno].mcofs = (uint16_t)ofs;  /* Remember mcode ofs. */
    } while (as->curins < as->snapref);  /* May have no ins inbetween. */
    as->snapalloc = 1;
  }
}